

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::ktx_texture::get_key_value_as_string(ktx_texture *this,char *pKey,dynamic_string *str)

{
  uint uVar1;
  uint8_vec *puVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  puVar2 = find_key(this,pKey);
  if (puVar2 == (uint8_vec *)0x0) {
    dynamic_string::clear(str);
  }
  else {
    sVar3 = strlen(pKey);
    uVar1 = (int)sVar3 + 1;
    uVar6 = 0;
    iVar4 = puVar2->m_size - uVar1;
    if (iVar4 != 0) {
      uVar5 = iVar4 + (uint)(iVar4 == 0);
      uVar6 = 0;
      do {
        if ((puVar2->m_p + uVar1)[uVar6] == '\0') goto LAB_00192d53;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar6 = (ulong)uVar5;
    }
LAB_00192d53:
    dynamic_string::set_from_buf(str,puVar2->m_p + uVar1,(uint)uVar6);
  }
  return puVar2 != (uint8_vec *)0x0;
}

Assistant:

bool ktx_texture::get_key_value_as_string(const char* pKey, dynamic_string& str) const
    {
        const uint8_vec* p = find_key(pKey);
        if (!p)
        {
            str.clear();
            return false;
        }

        const uint ofs = (static_cast<uint>(strlen(pKey)) + 1);
        const uint8* pValue = p->get_ptr() + ofs;
        const uint n = p->size() - ofs;

        uint i;
        for (i = 0; i < n; i++)
        {
            if (!pValue[i])
            {
                break;
            }
        }

        str.set_from_buf(pValue, i);
        return true;
    }